

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle.cpp
# Opt level: O2

int64_t __thiscall cornelich::vanilla_chronicle::last_index(vanilla_chronicle *this)

{
  vanilla_index *this_00;
  int32_t cycle;
  int32_t iVar1;
  int64_t iVar2;
  long lVar3;
  region_ptr region;
  
  this_00 = &this->m_index;
  cycle = vanilla_index::find_last_cycle(this_00);
  iVar2 = -1;
  if (cycle != -1) {
    iVar1 = vanilla_index::last_index_file_number(this_00,cycle,-1);
    if (iVar1 != -1) {
      vanilla_index::index_for((vanilla_index *)&region,(int32_t)this_00,cycle,SUB41(iVar1,0));
      if (region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        iVar2 = -1;
      }
      else {
        iVar2 = vanilla_index::count_index_entries
                          (region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        lVar3 = 0;
        if (0 < iVar2) {
          lVar3 = iVar2 + -1;
        }
        iVar2 = ((long)iVar1 << ((byte)this->m_index_block_size_bits & 0x3f)) +
                ((long)cycle << ((byte)this->m_entries_for_cycle_bits & 0x3f)) + lVar3;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&region.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  return iVar2;
}

Assistant:

std::int64_t vanilla_chronicle::last_index()
{
    const auto last_cycle = m_index.find_last_cycle();
    if(last_cycle == -1)
        return -1;

    const auto last_file = m_index.last_index_file_number(last_cycle, -1);
    if(last_file == -1)
        return -1;

    const auto region = m_index.index_for(last_cycle, last_file, false);
    if(!region)
        return -1;
    const auto count_entries = vanilla_index::count_index_entries(*region);
    const auto index_entry_number = (count_entries > 0) ? count_entries - 1 : 0;

    return (static_cast<std::int64_t>(last_cycle) <<  m_entries_for_cycle_bits) +
           (static_cast<std::int64_t>(last_file) << m_index_block_size_bits) +
           index_entry_number;
}